

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::SerializeWithCachedSizes
          (BayesianProbitRegressor_Gaussian *this,CodedOutputStream *output)

{
  double dVar1;
  
  dVar1 = this->mean_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    google::protobuf::internal::WireFormatLite::WriteDouble(1,dVar1,output);
  }
  dVar1 = this->precision_;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(2,dVar1,output);
  return;
}

Assistant:

void BayesianProbitRegressor_Gaussian::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double mean = 1;
  if (this->mean() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(1, this->mean(), output);
  }

  // double precision = 2;
  if (this->precision() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->precision(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BayesianProbitRegressor.Gaussian)
}